

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsgbmscreen.cpp
# Opt level: O2

void __thiscall QEglFSKmsGbmScreen::ensureModeSet(QEglFSKmsGbmScreen *this,uint32_t fb)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  pointer p_Var6;
  drmModeAtomicReq *pdVar7;
  int *piVar8;
  undefined8 *puVar9;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_88;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char> local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = QKmsDevice::fd(*(QKmsDevice **)&this->field_0x28);
  if ((this->field_0x70 != '\x01') || (this->needsNewModeSetForNextFb == true)) {
    this->field_0x70 = 1;
    this->needsNewModeSetForNextFb = false;
    lVar5 = drmModeGetCrtc(iVar3,*(undefined4 *)&this->field_0x50);
    if (lVar5 != 0) {
      if (*(uint32_t *)(lVar5 + 4) == fb) {
        iVar4 = *(int *)&this->field_0x6c;
        p_Var6 = QList<_drmModeModeInfo>::data((QList<_drmModeModeInfo> *)&this->field_0x80);
        iVar4 = bcmp((void *)(lVar5 + 0x1c),p_Var6 + iVar4,0x44);
        drmModeFreeCrtc(lVar5);
        if (iVar4 == 0) goto LAB_001129ab;
      }
      else {
        drmModeFreeCrtc(lVar5);
      }
    }
    lVar5 = QtPrivateLogging::qLcEglfsKmsDebug();
    if ((*(byte *)(lVar5 + 0x10) & 1) != 0) {
      local_40 = *(undefined8 *)(lVar5 + 8);
      local_58.d._0_4_ = 2;
      local_58.size._4_4_ = 0;
      local_58.d._4_4_ = 0;
      local_58.ptr._0_4_ = 0;
      local_58.ptr._4_4_ = 0;
      local_58.size._0_4_ = 0;
      (**(code **)(*(long *)this + 0x90))(&QStack_88,this);
      QString::toLocal8Bit((QByteArray *)&local_70,(QString *)&QStack_88);
      if (local_70.ptr == (char16_t *)0x0) {
        local_70.ptr = (char16_t *)&QByteArray::_empty;
      }
      QMessageLogger::debug((char *)&local_58,"Setting mode for screen %s",local_70.ptr);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_70);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_88);
    }
    bVar2 = QKmsDevice::hasAtomicSupport(*(QKmsDevice **)&this->field_0x28);
    if (bVar2) {
      pdVar7 = QKmsDevice::threadLocalAtomicRequest(*(QKmsDevice **)&this->field_0x28);
      if (pdVar7 != (drmModeAtomicReq *)0x0) {
        drmModeAtomicAddProperty
                  (pdVar7,*(undefined4 *)&this->field_0x48,*(undefined4 *)&this->field_0x108,
                   *(undefined4 *)&this->field_0x50);
        drmModeAtomicAddProperty
                  (pdVar7,*(undefined4 *)&this->field_0x50,*(undefined4 *)&this->field_0x10c,
                   *(undefined4 *)&this->field_0x114);
        drmModeAtomicAddProperty
                  (pdVar7,*(undefined4 *)&this->field_0x50,*(undefined4 *)&this->field_0x110,1);
      }
    }
    else {
      uVar1 = *(undefined4 *)&this->field_0x50;
      iVar4 = *(int *)&this->field_0x6c;
      p_Var6 = QList<_drmModeModeInfo>::data((QList<_drmModeModeInfo> *)&this->field_0x80);
      iVar3 = drmModeSetCrtc(iVar3,uVar1,fb,0,0,&this->field_0x48,1,p_Var6 + iVar4);
      if (iVar3 == 0) {
        (**(code **)(*(long *)this + 200))(this,0);
      }
      else {
        piVar8 = __errno_location();
        iVar3 = *piVar8;
        (**(code **)(*(long *)this + 0x90))(&local_70,this);
        QString::toLocal8Bit((QByteArray *)&local_58,(QString *)&local_70);
        puVar9 = (undefined8 *)CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_);
        if (puVar9 == (undefined8 *)0x0) {
          puVar9 = &QByteArray::_empty;
        }
        qErrnoWarning(iVar3,"Could not set DRM mode for screen %s",puVar9);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
      }
    }
  }
LAB_001129ab:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QEglFSKmsGbmScreen::ensureModeSet(uint32_t fb)
{
    QKmsOutput &op(output());
    const int fd = device()->fd();

    if (!op.mode_set || needsNewModeSetForNextFb) {
        op.mode_set = true;
        needsNewModeSetForNextFb = false;

        bool doModeSet = true;
        drmModeCrtcPtr currentMode = drmModeGetCrtc(fd, op.crtc_id);
        const bool alreadySet = currentMode && currentMode->buffer_id == fb && !memcmp(&currentMode->mode, &op.modes[op.mode], sizeof(drmModeModeInfo));
        if (currentMode)
            drmModeFreeCrtc(currentMode);
        if (alreadySet)
            doModeSet = false;

        if (doModeSet) {
            qCDebug(qLcEglfsKmsDebug, "Setting mode for screen %s", qPrintable(name()));

            if (device()->hasAtomicSupport()) {
#if QT_CONFIG(drm_atomic)
                drmModeAtomicReq *request = device()->threadLocalAtomicRequest();
                if (request) {
                    drmModeAtomicAddProperty(request, op.connector_id, op.crtcIdPropertyId, op.crtc_id);
                    drmModeAtomicAddProperty(request, op.crtc_id, op.modeIdPropertyId, op.mode_blob_id);
                    drmModeAtomicAddProperty(request, op.crtc_id, op.activePropertyId, 1);
                }
#endif
            } else {
                int ret = drmModeSetCrtc(fd,
                                         op.crtc_id,
                                         fb,
                                         0, 0,
                                         &op.connector_id, 1,
                                         &op.modes[op.mode]);

                if (ret == 0)
                    setPowerState(PowerStateOn);
                else
                    qErrnoWarning(errno, "Could not set DRM mode for screen %s", qPrintable(name()));
            }
        }
    }
}